

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O3

adjusted_mantissa fast_float::positive_digit_comp<float>(bigint *bigmant,int32_t exponent)

{
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  adjusted_mantissa aVar11;
  bool truncated;
  bool local_19;
  
  bVar1 = bigint::pow5(bigmant,exponent);
  if (bVar1) {
    bigint::shl(bigmant,(ulong)(uint)exponent);
  }
  uVar3 = bigint::hi64(bigmant,&local_19);
  iVar2 = bigint::ctlz(bigmant);
  uVar9 = (uint)(bigmant->vec).length * 0x40 - iVar2;
  if ((int)uVar9 < -0x7d) {
    uVar8 = 0;
    if (-uVar9 - 0x55 < 0x40) {
      uVar8 = -uVar9 - 0x55;
    }
    bVar7 = (byte)uVar8;
    uVar6 = 0;
    if (0xffffff6b < uVar9) {
      uVar6 = uVar3 >> (bVar7 & 0x3f);
    }
    uVar4 = ~(-1L << (bVar7 & 0x3f));
    if (0xffffff6b >= uVar9) {
      uVar4 = 0xffffffffffffffff;
    }
    uVar4 = uVar4 & uVar3;
    uVar5 = 1;
    uVar10 = 1L << (bVar7 - 1 & 0x3f);
    if ((uVar4 <= uVar10) && ((uVar4 != uVar10 || (local_19 == false)))) {
      uVar5 = (ulong)(uVar4 == uVar10 & (byte)uVar6);
    }
    uVar4 = (ulong)(0x7fffff < uVar5 + uVar6);
    uVar6 = uVar5 + uVar6;
  }
  else {
    uVar4 = 1;
    if (((uVar3 & 0xffffffffff) < 0x8000000001) &&
       (((uVar3 & 0xffffffffff) != 0x8000000000 || (local_19 == false)))) {
      uVar4 = (ulong)((uVar3 & 0x1ffffffffff) == 0x18000000000);
    }
    uVar4 = uVar4 + (uVar3 >> 0x28);
    uVar9 = (uVar4 < 0x1000000 ^ 0x7f) + uVar9;
    uVar6 = (ulong)((uint)uVar4 & 0x17fffff);
    if (uVar4 >= 0x1000000) {
      uVar6 = 0;
    }
    uVar8 = uVar9;
    if (0xfe < uVar9) {
      uVar8 = 0xff;
    }
    uVar4 = (ulong)uVar8;
    if (0xfe < uVar9) {
      uVar6 = 0;
    }
  }
  aVar11._8_8_ = uVar4;
  aVar11.mantissa = uVar6;
  return aVar11;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa positive_digit_comp(bigint& bigmant, int32_t exponent) noexcept {
  FASTFLOAT_ASSERT(bigmant.pow10(uint32_t(exponent)));
  adjusted_mantissa answer;
  bool truncated;
  answer.mantissa = bigmant.hi64(truncated);
  int bias = binary_format<T>::mantissa_explicit_bits() - binary_format<T>::minimum_exponent();
  answer.power2 = bigmant.bit_length() - 64 + bias;

  round<T>(answer, [truncated](adjusted_mantissa& a, int32_t shift) {
    round_nearest_tie_even(a, shift, [truncated](bool is_odd, bool is_halfway, bool is_above) -> bool {
      return is_above || (is_halfway && truncated) || (is_odd && is_halfway);
    });
  });

  return answer;
}